

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void deferred_on_data(void *uuid,void *arg2)

{
  undefined1 *puVar1;
  char cVar2;
  fio_defer_task_s task;
  int __epfd;
  fio_data_s *pfVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  undefined8 *puVar8;
  long lVar9;
  fio_lock_i ret;
  undefined1 local_5c [20];
  code *local_48;
  void *pvStack_40;
  undefined8 local_38;
  
  iVar4 = fio_is_closed((intptr_t)uuid);
  pfVar3 = fio_data;
  if (iVar4 != 0) {
    return;
  }
  iVar4 = (int)((ulong)uuid >> 8);
  local_5c._12_8_ = SEXT48(iVar4);
  lVar9 = local_5c._12_8_ * 0xa8;
  if (*(long *)((long)fio_data + lVar9 + 0x58) == 0) {
    deferred_on_ready(uuid,arg2);
    return;
  }
  piVar6 = __errno_location();
  *piVar6 = 0;
  LOCK();
  pcVar7 = (char *)((long)pfVar3 + lVar9 + 0x6c);
  cVar2 = *pcVar7;
  *pcVar7 = '\x01';
  UNLOCK();
  local_5c[0] = cVar2;
  if (cVar2 == '\0') {
    puVar8 = *(undefined8 **)((long)fio_data + lVar9 + 0x58);
    if (puVar8 == (undefined8 *)0x0) {
      LOCK();
      pcVar7 = (char *)((long)fio_data + lVar9 + 0x6c);
      local_5c[0] = *pcVar7;
      *pcVar7 = '\0';
      UNLOCK();
      puVar8 = (undefined8 *)0x0;
      *piVar6 = 9;
      goto LAB_0012b13c;
    }
    LOCK();
    cVar2 = *(char *)(puVar8 + 5);
    *(char *)(puVar8 + 5) = '\x01';
    UNLOCK();
    pcVar7 = (char *)((long)fio_data + lVar9 + 0x6c);
    if (cVar2 == '\0') {
      LOCK();
      local_5c[0] = *pcVar7;
      *pcVar7 = '\0';
      UNLOCK();
      goto LAB_0012b13c;
    }
    LOCK();
    local_5c[0] = *pcVar7;
    *pcVar7 = '\0';
    UNLOCK();
  }
  *piVar6 = 0xb;
  puVar8 = (undefined8 *)0x0;
LAB_0012b13c:
  if (puVar8 == (undefined8 *)0x0) {
    if (*piVar6 != 9) {
      if (arg2 == (void *)0x0) {
        fio_poll_add_read(local_5c._12_8_);
        return;
      }
      local_48 = deferred_on_data;
      local_38 = 1;
      task.arg1 = uuid;
      task.func = deferred_on_data;
      task.arg2 = &DAT_00000001;
      pvStack_40 = uuid;
      fio_defer_push_task_fn(task,&task_queue_normal);
    }
  }
  else {
    LOCK();
    puVar1 = (undefined1 *)((long)fio_data + lVar9 + 0x6b);
    local_5c[0] = *puVar1;
    *puVar1 = 0;
    UNLOCK();
    (*(code *)*puVar8)(uuid,puVar8);
    LOCK();
    *(undefined1 *)(puVar8 + 5) = 0;
    UNLOCK();
    LOCK();
    pcVar7 = (char *)((long)fio_data + lVar9 + 0x6b);
    cVar2 = *pcVar7;
    *pcVar7 = '\x01';
    __epfd = evio_fd[1];
    UNLOCK();
    if (cVar2 == '\0') {
      do {
        *piVar6 = 0;
        local_5c._0_4_ = 0x40002011;
        local_5c._4_4_ = iVar4;
        iVar5 = epoll_ctl(__epfd,3,iVar4,(epoll_event *)local_5c);
        if ((iVar5 == -1) && (*piVar6 == 2)) {
          *piVar6 = 0;
          local_5c._0_4_ = 0x40002011;
          local_5c._4_4_ = iVar4;
          epoll_ctl(__epfd,1,iVar4,(epoll_event *)local_5c);
        }
      } while (*piVar6 == 4);
    }
  }
  return;
}

Assistant:

static void deferred_on_data(void *uuid, void *arg2) {
  if (fio_is_closed((intptr_t)uuid)) {
    return;
  }
  if (!uuid_data(uuid).protocol)
    goto no_protocol;
  fio_protocol_s *pr = protocol_try_lock(fio_uuid2fd(uuid), FIO_PR_LOCK_TASK);
  if (!pr) {
    if (errno == EBADF) {
      return;
    }
    goto postpone;
  }
  fio_unlock(&uuid_data(uuid).scheduled);
  pr->on_data((intptr_t)uuid, pr);
  protocol_unlock(pr, FIO_PR_LOCK_TASK);
  if (!fio_trylock(&uuid_data(uuid).scheduled)) {
    fio_poll_add_read(fio_uuid2fd((intptr_t)uuid));
  }
  return;

postpone:
  if (arg2) {
    /* the event is being forced, so force rescheduling */
    fio_defer_push_task(deferred_on_data, (void *)uuid, (void *)1);
  } else {
    /* the protocol was locked, so there might not be any need for the event */
    fio_poll_add_read(fio_uuid2fd((intptr_t)uuid));
  }
  return;

no_protocol:
  /* a missing protocol might still want to invoke the RW hook flush */
  deferred_on_ready(uuid, arg2);
  return;
}